

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O3

void __thiscall
Rml::FilterBlur::ExtendInkOverflow(FilterBlur *this,Element *element,Rectanglef *scissor_region)

{
  Vector2Type VVar1;
  float fVar2;
  
  fVar2 = Element::ResolveLength(element,this->sigma_value);
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  fVar2 = fVar2 * 3.0;
  VVar1 = scissor_region->p1;
  (scissor_region->p0).x = (scissor_region->p0).x - fVar2;
  (scissor_region->p0).y = (scissor_region->p0).y - fVar2;
  (scissor_region->p1).x = VVar1.x + fVar2;
  (scissor_region->p1).y = VVar1.y + fVar2;
  return;
}

Assistant:

void FilterBlur::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	const float sigma = element->ResolveLength(sigma_value);
	const float blur_extent = 3.0f * Math::Max(sigma, 1.f);
	scissor_region = scissor_region.Extend(blur_extent);
}